

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Curiosity.cpp
# Opt level: O3

void __thiscall
chrono::curiosity::CuriosityWheel::CuriosityWheel
          (CuriosityWheel *this,string *name,ChFrame<double> *rel_pos,
          shared_ptr<chrono::ChMaterialSurface> *mat,CuriosityWheelType wheel_type)

{
  undefined8 uVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  char *pcVar3;
  undefined1 auVar4 [16];
  shared_ptr<chrono::ChMaterialSurface> local_d8;
  ChQuaternion<double> local_c0;
  ChFrame<double> local_a0;
  
  local_d8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_d8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
          _M_refcount._M_pi;
  p_Var2 = (mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  CuriosityPart::CuriosityPart(&this->super_CuriosityPart,name,rel_pos,&local_d8,true);
  if (local_d8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  (this->super_CuriosityPart)._vptr_CuriosityPart = (_func_int **)&PTR__CuriosityPart_0017e9c0;
  if (wheel_type == SimpleWheel) {
    pcVar3 = "curiosity_simplewheel";
  }
  else if (wheel_type == CylWheel) {
    pcVar3 = "curiosity_cylwheel";
  }
  else {
    pcVar3 = "curiosity_wheel";
  }
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_CuriosityPart).m_mesh_name,0,
             (char *)(this->super_CuriosityPart).m_mesh_name._M_string_length,(ulong)pcVar3);
  auVar4._8_4_ = 0x3f800000;
  auVar4._0_8_ = 0x3f8000003f800000;
  auVar4._12_4_ = 0x3f800000;
  uVar1 = vmovlps_avx(auVar4);
  (this->super_CuriosityPart).m_color.R = (float)(int)uVar1;
  (this->super_CuriosityPart).m_color.G = (float)(int)((ulong)uVar1 >> 0x20);
  (this->super_CuriosityPart).m_color.B = 1.0;
  (this->super_CuriosityPart).m_mass = 1.7812830345854127;
  (this->super_CuriosityPart).m_inertia.m_data[0] = 0.07923769199375999;
  (this->super_CuriosityPart).m_inertia.m_data[1] = 0.11097450306524229;
  (this->super_CuriosityPart).m_inertia.m_data[2] = 0.07923769199375999;
  local_c0.m_data[0] = 1.0;
  local_a0._vptr_ChFrame = (_func_int **)&PTR__ChFrame_0017db90;
  local_c0.m_data[3] = 0.0;
  local_a0.coord.pos.m_data[2] = 0.0;
  local_a0.coord.pos.m_data[0] = 0.0;
  local_a0.coord.pos.m_data[1] = 0.0;
  local_a0.coord.rot.m_data[0] = 1.0;
  local_c0.m_data[1] = 0.0;
  local_c0.m_data[2] = 0.0;
  local_a0.coord.rot.m_data[1] = 0.0;
  local_a0.coord.rot.m_data[2] = 0.0;
  local_a0.coord.rot.m_data[3] = 0.0;
  ChMatrix33<double>::ChMatrix33(&local_a0.Amatrix,&local_c0);
  ChFrame<double>::operator=(&(this->super_CuriosityPart).m_cog,&local_a0);
  return;
}

Assistant:

CuriosityWheel::CuriosityWheel(const std::string& name,
                               const ChFrame<>& rel_pos,
                               std::shared_ptr<ChMaterialSurface> mat,
                               CuriosityWheelType wheel_type)
    : CuriosityPart(name, rel_pos, mat, true) {
    switch (wheel_type) {
        default:
        case CuriosityWheelType::RealWheel:
            m_mesh_name = "curiosity_wheel";
            break;
        case CuriosityWheelType::SimpleWheel:
            m_mesh_name = "curiosity_simplewheel";
            break;
        case CuriosityWheelType::CylWheel:
            m_mesh_name = "curiosity_cylwheel";
            break;
    }
    m_color = ChColor(1.0f, 1.0f, 1.0f);

    double radius = 0.25;       // wheel radius
    double width = 0.40;        // wheel width
    double thickness = 0.8e-3;  // average thickness
    double density = 2700;      // aluminum
    double radius1 = radius - thickness;
    double vol = (CH_C_2PI * radius * width + CH_C_PI * radius * radius) * thickness;
    double gyration1 = (3 * (radius * radius + radius1 * radius1) + width * width) / 12.0;
    double gyration2 = (radius * radius + radius1 * radius1) / 2.0;
    m_mass = density * vol;
    m_inertia = ChVector<>(gyration1, gyration2, gyration1) * m_mass;
    m_cog = ChFrame<>();
}